

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void __thiscall kratos::Generator::remove_stmt(Generator *this,shared_ptr<kratos::Stmt> *stmt)

{
  bool bVar1;
  const_iterator local_50;
  __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
  local_48;
  shared_ptr<kratos::Stmt> *local_40;
  __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
  local_38;
  __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
  local_30;
  __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
  pos;
  shared_ptr<kratos::Stmt> *stmt_local;
  Generator *this_local;
  
  if ((this->use_stmts_remove_cache_ & 1U) == 0) {
    local_38._M_current =
         (shared_ptr<kratos::Stmt> *)
         std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
         ::begin(&this->stmts_);
    local_40 = (shared_ptr<kratos::Stmt> *)
               std::
               vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
               ::end(&this->stmts_);
    local_30 = std::
               find<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Stmt>*,std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>>,std::shared_ptr<kratos::Stmt>>
                         (local_38,(__normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
                                    )local_40,stmt);
    local_48._M_current =
         (shared_ptr<kratos::Stmt> *)
         std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
         ::end(&this->stmts_);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_48);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<kratos::Stmt>const*,std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>>
      ::__normal_iterator<std::shared_ptr<kratos::Stmt>*>
                ((__normal_iterator<std::shared_ptr<kratos::Stmt>const*,std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>>
                  *)&local_50,&local_30);
      std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
      erase(&this->stmts_,local_50);
    }
  }
  else {
    std::
    unordered_set<std::shared_ptr<kratos::Stmt>,std::hash<std::shared_ptr<kratos::Stmt>>,std::equal_to<std::shared_ptr<kratos::Stmt>>,std::allocator<std::shared_ptr<kratos::Stmt>>>
    ::emplace<std::shared_ptr<kratos::Stmt>const&>
              ((unordered_set<std::shared_ptr<kratos::Stmt>,std::hash<std::shared_ptr<kratos::Stmt>>,std::equal_to<std::shared_ptr<kratos::Stmt>>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                *)&this->stmts_remove_cache_,stmt);
  }
  return;
}

Assistant:

void Generator::remove_stmt(const std::shared_ptr<Stmt> &stmt) {
    if (use_stmts_remove_cache_) {
        stmts_remove_cache_.emplace(stmt);
        return;
    }
    auto pos = std::find(stmts_.begin(), stmts_.end(), stmt);
    if (pos != stmts_.end()) {
        stmts_.erase(pos);
    }
}